

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

int32_t icu_63::getSamplesFromString
                  (UnicodeString *samples,double *dest,int32_t destCapacity,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int32_t limit;
  int32_t iVar4;
  long lVar5;
  int iVar6;
  int32_t iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int local_168;
  FixedDecimal fixedLo;
  UnicodeString local_f0;
  FixedDecimal fixedHi;
  UnicodeString local_70;
  
  local_168 = 0;
  iVar7 = 0;
  do {
    if (destCapacity <= iVar7) {
      return iVar7;
    }
    sVar1 = (samples->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (samples->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (iVar6 <= local_168) {
      return iVar7;
    }
    limit = UnicodeString::indexOf(samples,L',',local_168);
    if (limit == -1) {
      sVar1 = (samples->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        limit = (samples->fUnion).fFields.fLength;
      }
      else {
        limit = (int)sVar1 >> 5;
      }
    }
    UnicodeString::tempSubStringBetween(&local_f0,samples,local_168,limit);
    iVar4 = UnicodeString::indexOf(&local_f0,L'~');
    if (iVar4 < 0) {
      FixedDecimal::FixedDecimal(&fixedLo,&local_f0,status);
      dVar12 = fixedLo.source;
      dVar8 = floor(fixedLo.source);
      if (fixedLo.visibleDecimalDigitCount == 0) {
LAB_00263064:
        lVar5 = (long)iVar7;
        iVar7 = iVar7 + 1;
        dest[lVar5] = dVar12;
      }
      else if ((dVar12 != dVar8) || (NAN(dVar12) || NAN(dVar8))) goto LAB_00263064;
      FixedDecimal::~FixedDecimal(&fixedLo);
LAB_0026307e:
      local_168 = limit + 1;
      bVar3 = false;
    }
    else {
      UnicodeString::tempSubString((UnicodeString *)&fixedHi,&local_f0,0,iVar4);
      FixedDecimal::FixedDecimal(&fixedLo,(UnicodeString *)&fixedHi,status);
      UnicodeString::~UnicodeString((UnicodeString *)&fixedHi);
      UnicodeString::tempSubStringBetween(&local_70,&local_f0,iVar4 + 1,0x7fffffff);
      FixedDecimal::FixedDecimal(&fixedHi,&local_70,status);
      UnicodeString::~UnicodeString(&local_70);
      dVar8 = fixedHi.source;
      dVar12 = fixedLo.source;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (fixedHi.source < fixedLo.source) {
          *status = U_INVALID_FORMAT_ERROR;
          goto LAB_00263004;
        }
        dVar9 = scaleForInt(fixedLo.source);
        dVar10 = scaleForInt(dVar8);
        iVar4 = fixedLo.visibleDecimalDigitCount;
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        dVar12 = dVar12 * dVar10;
        while( true ) {
          bVar3 = false;
          bVar2 = true;
          if (dVar8 * dVar10 < dVar12) break;
          dVar9 = dVar12 / dVar10;
          dVar11 = floor(dVar9);
          if (((dVar9 != dVar11) || (NAN(dVar9) || NAN(dVar11))) || (iVar4 < 1)) {
            lVar5 = (long)iVar7;
            iVar7 = iVar7 + 1;
            dest[lVar5] = dVar9;
          }
          if (destCapacity <= iVar7) break;
          dVar12 = dVar12 + 1.0;
        }
      }
      else {
LAB_00263004:
        bVar2 = false;
        bVar3 = true;
      }
      FixedDecimal::~FixedDecimal(&fixedHi);
      FixedDecimal::~FixedDecimal(&fixedLo);
      if (bVar2) goto LAB_0026307e;
    }
    UnicodeString::~UnicodeString(&local_f0);
    if (bVar3) {
      return iVar7;
    }
  } while( true );
}

Assistant:

static int32_t
getSamplesFromString(const UnicodeString &samples, double *dest,
                        int32_t destCapacity, UErrorCode& status) {
    int32_t sampleCount = 0;
    int32_t sampleStartIdx = 0;
    int32_t sampleEndIdx = 0;

    //std::string ss;  // TODO: debugging.
    // std::cout << "PluralRules::getSamples(), samples = \"" << samples.toUTF8String(ss) << "\"\n";
    for (sampleCount = 0; sampleCount < destCapacity && sampleStartIdx < samples.length(); ) {
        sampleEndIdx = samples.indexOf(COMMA, sampleStartIdx);
        if (sampleEndIdx == -1) {
            sampleEndIdx = samples.length();
        }
        const UnicodeString &sampleRange = samples.tempSubStringBetween(sampleStartIdx, sampleEndIdx);
        // ss.erase();
        // std::cout << "PluralRules::getSamples(), samplesRange = \"" << sampleRange.toUTF8String(ss) << "\"\n";
        int32_t tildeIndex = sampleRange.indexOf(TILDE);
        if (tildeIndex < 0) {
            FixedDecimal fixed(sampleRange, status);
            double sampleValue = fixed.source;
            if (fixed.visibleDecimalDigitCount == 0 || sampleValue != floor(sampleValue)) {
                dest[sampleCount++] = sampleValue;
            }
        } else {

            FixedDecimal fixedLo(sampleRange.tempSubStringBetween(0, tildeIndex), status);
            FixedDecimal fixedHi(sampleRange.tempSubStringBetween(tildeIndex+1), status);
            double rangeLo = fixedLo.source;
            double rangeHi = fixedHi.source;
            if (U_FAILURE(status)) {
                break;
            }
            if (rangeHi < rangeLo) {
                status = U_INVALID_FORMAT_ERROR;
                break;
            }

            // For ranges of samples with fraction decimal digits, scale the number up so that we
            //   are adding one in the units place. Avoids roundoffs from repetitive adds of tenths.

            double scale = scaleForInt(rangeLo);
            double t = scaleForInt(rangeHi);
            if (t > scale) {
                scale = t;
            }
            rangeLo *= scale;
            rangeHi *= scale;
            for (double n=rangeLo; n<=rangeHi; n+=1) {
                // Hack Alert: don't return any decimal samples with integer values that
                //    originated from a format with trailing decimals.
                //    This API is returning doubles, which can't distinguish having displayed
                //    zeros to the right of the decimal.
                //    This results in test failures with values mapping back to a different keyword.
                double sampleValue = n/scale;
                if (!(sampleValue == floor(sampleValue) && fixedLo.visibleDecimalDigitCount > 0)) {
                    dest[sampleCount++] = sampleValue;
                }
                if (sampleCount >= destCapacity) {
                    break;
                }
            }
        }
        sampleStartIdx = sampleEndIdx + 1;
    }
    return sampleCount;
}